

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O2

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,Mat *left_rect,Mat *right_rect)

{
  int *piVar1;
  undefined2 uVar2;
  int iVar3;
  ostream *poVar4;
  uchar *puVar5;
  int j;
  long lVar6;
  int i;
  long lVar7;
  
  iVar3 = capture_frame(this);
  if (iVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error : failed to capture Infrared frame.");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  cv::Mat::create((int)left_rect,0x1e0,0x280);
  cv::Mat::create((int)right_rect,0x1e0,0x280);
  puVar5 = this->m_pBigBuffer;
  for (lVar7 = 0; lVar7 != 0x1e0; lVar7 = lVar7 + 1) {
    for (lVar6 = 0; lVar6 != 0x280; lVar6 = lVar6 + 1) {
      uVar2 = *(undefined2 *)(puVar5 + lVar6 * 2);
      *(char *)(lVar6 + **(long **)(left_rect + 0x48) * lVar7 + *(long *)(left_rect + 0x10)) =
           (char)uVar2;
      *(char *)(lVar6 + **(long **)(right_rect + 0x48) * lVar7 + *(long *)(right_rect + 0x10)) =
           (char)((ushort)uVar2 >> 8);
    }
    puVar5 = puVar5 + 0x500;
  }
  piVar1 = &(this->super_CameraBase).m_frameCount;
  *piVar1 = *piVar1 + 1;
  CameraBase::saveFrame(&this->super_CameraBase,left_rect,right_rect);
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (cv::Mat &left_rect, cv::Mat &right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    left_rect.create  (480, 640, CV_8UC1);
    right_rect.create (480, 640, CV_8UC1);
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect.at<unsigned char> (i, j)  = lr_pixel % 256;
            right_rect.at<unsigned char> (i, j) = lr_pixel / 256;
        }
    }
    incrementFrameCount ();
    saveFrame (left_rect, right_rect);
}